

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-queue-order.c
# Opt level: O0

int run_test_tcp_write_queue_order(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int local_7c;
  undefined1 local_78 [4];
  int buffer_size;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  local_7c = 0x4000;
  start_server();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_78);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x75,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x77,"0 == uv_tcp_init(uv_default_loop(), &client)");
    abort();
  }
  iVar1 = uv_tcp_connect((uv_connect_t *)addr.sin_zero,&client,(sockaddr *)local_78,connect_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x7b,"0 == uv_tcp_connect(&connect_req, &client, (struct sockaddr*) &addr, connect_cb)"
           );
    abort();
  }
  iVar1 = uv_send_buffer_size((uv_handle_t *)&client,&local_7c);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x7c,"0 == uv_send_buffer_size((uv_handle_t*) &client, &buffer_size)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x7e,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  if (connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x80,"connect_cb_called == 1");
    abort();
  }
  if (connection_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x81,"connection_cb_called == 1");
    abort();
  }
  if (write_callbacks < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x82,"write_callbacks > 0");
    abort();
  }
  if (write_cancelled_callbacks < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x83,"write_cancelled_callbacks > 0");
    abort();
  }
  if (write_callbacks + write_error_callbacks + write_cancelled_callbacks != 10000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x86,"write_callbacks + write_error_callbacks + write_cancelled_callbacks == REQ_COUNT"
           );
    abort();
  }
  if (close_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x87,"close_cb_called == 3");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x89,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_write_queue_order) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  int buffer_size = 16 * 1024;

  start_server();

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &client));
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client,
                             (struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_send_buffer_size((uv_handle_t*) &client, &buffer_size));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(connect_cb_called == 1);
  ASSERT(connection_cb_called == 1);
  ASSERT(write_callbacks > 0);
  ASSERT(write_cancelled_callbacks > 0);
  ASSERT(write_callbacks +
         write_error_callbacks +
         write_cancelled_callbacks == REQ_COUNT);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}